

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleClientProtocolError
          (HttpServerErrorHandler *this,ProtocolError protocolError,Response *response)

{
  ArrayDisposer *pAVar1;
  size_t sVar2;
  StringPtr *in_RCX;
  char *pcVar3;
  undefined8 *in_RDX;
  AsyncOutputStream *pAVar4;
  StringPtr value;
  HttpHeaderTable headerTable;
  HttpHeaders headers;
  String local_100;
  String local_e8;
  undefined1 local_c8;
  char *local_c0;
  HttpHeaderTable local_b8;
  HttpHeaders local_80;
  
  HttpHeaderTable::HttpHeaderTable(&local_b8);
  HttpHeaders::HttpHeaders(&local_80,&local_b8);
  value.content.size_ = 0xb;
  value.content.ptr = "text/plain";
  anon_unknown_36::requireValidHeaderValue(value);
  local_80.indexedHeaders.ptr[0xe].content.ptr = "text/plain";
  local_80.indexedHeaders.ptr[0xe].content.size_ = 0xb;
  str<char_const(&)[8],kj::StringPtr&>
            (&local_e8,(kj *)"ERROR: ",(char (*) [8])&protocolError.description,in_RCX);
  local_c0 = (char *)0x0;
  if ((AsyncOutputStream *)local_e8.content.size_ != (AsyncOutputStream *)0x0) {
    local_c0 = (char *)((long)&((AsyncOutputStream *)(local_e8.content.size_ + -8))->
                               _vptr_AsyncOutputStream + 7);
  }
  local_c8 = 1;
  (**(code **)*in_RDX)(&local_100.content.size_);
  pAVar4 = (AsyncOutputStream *)local_e8.content.size_;
  if ((AsyncOutputStream *)local_e8.content.size_ != (AsyncOutputStream *)0x0) {
    pAVar4 = (AsyncOutputStream *)local_e8.content.ptr;
  }
  pcVar3 = (char *)0x0;
  if ((AsyncOutputStream *)local_e8.content.size_ != (AsyncOutputStream *)0x0) {
    pcVar3 = (char *)((long)&((AsyncOutputStream *)(local_e8.content.size_ + -8))->
                             _vptr_AsyncOutputStream + 7);
  }
  (**(local_100.content.disposer)->_vptr_ArrayDisposer)
            (&local_100,local_100.content.disposer,pAVar4,pcVar3);
  Promise<void>::attach<kj::String,kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,&local_100,
             (Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_e8);
  pcVar3 = local_100.content.ptr;
  if ((PromiseArenaMember *)local_100.content.ptr != (PromiseArenaMember *)0x0) {
    local_100.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar3);
  }
  pAVar1 = local_100.content.disposer;
  if (local_100.content.disposer != (ArrayDisposer *)0x0) {
    local_100.content.disposer = (ArrayDisposer *)0x0;
    (*(code *)**(undefined8 **)local_100.content.size_)
              (local_100.content.size_,
               pAVar1->_vptr_ArrayDisposer[-2] + (long)&pAVar1->_vptr_ArrayDisposer);
  }
  sVar2 = local_e8.content.size_;
  pcVar3 = local_e8.content.ptr;
  if ((AsyncOutputStream *)local_e8.content.ptr != (AsyncOutputStream *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.content.disposer,pcVar3,1,sVar2,sVar2,0);
  }
  HttpHeaders::~HttpHeaders(&local_80);
  HttpHeaderTable::~HttpHeaderTable(&local_b8);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleClientProtocolError(
    HttpHeaders::ProtocolError protocolError, kj::HttpService::Response& response) {
  // Default error handler implementation.

  HttpHeaderTable headerTable {};
  HttpHeaders headers(headerTable);
  headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

  auto errorMessage = kj::str("ERROR: ", protocolError.description);
  auto body = response.send(protocolError.statusCode, protocolError.statusMessage,
                            headers, errorMessage.size());

  return body->write(errorMessage.asBytes()).attach(kj::mv(errorMessage), kj::mv(body));
}